

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O1

Bool MergeNestedElements(TidyDocImpl *doc,TidyTagId Id,TidyTriState state,Node *node,Node **pnode)

{
  Node *child;
  Bool BVar1;
  Bool BVar2;
  
  BVar2 = no;
  BVar1 = no;
  if (((((node != (Node *)0x0 && state != TidyNoState) && (BVar1 = BVar2, node->tag != (Dict *)0x0))
       && (node->tag->id == Id)) &&
      ((child = node->content, child != (Node *)0x0 && (child->next == (Node *)0x0)))) &&
     ((child->tag != (Dict *)0x0 && (child->tag->id == Id)))) {
    if ((state == TidyAutoState) && (BVar1 = CopyAttrs(doc,node,child), BVar1 == no)) {
      return no;
    }
    MergeStyles(doc,node,child);
    StripOnlyChild(doc,node);
    BVar1 = yes;
  }
  return BVar1;
}

Assistant:

static Bool MergeNestedElements( TidyDocImpl* doc,
                                 TidyTagId Id, TidyTriState state, Node *node,
                                 Node **ARG_UNUSED(pnode))
{
    Node *child;

    if ( state == TidyNoState
         || !TagIsId(node, Id) )
        return no;

    child = node->content;

    if ( child == NULL
         || child->next != NULL
         || !TagIsId(child, Id) )
        return no;

    if ( state == TidyAutoState
         && CopyAttrs(doc, node, child) == no )
        return no;

    MergeStyles( doc, node, child );
    StripOnlyChild( doc, node );
    return yes;
}